

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

void __thiscall
GlobalBailOutRecordDataTable::AddOrUpdateRow
          (GlobalBailOutRecordDataTable *this,JitArenaAllocator *allocator,uint32 bailOutRecordId,
          uint32 regSlot,bool isFloat,bool isInt,int32 offset,uint *lastUpdatedRowIndex)

{
  uint32 uVar1;
  code *pcVar2;
  JitArenaAllocator *this_00;
  bool bVar3;
  undefined4 *puVar4;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_01;
  GlobalBailOutRecordDataRow *pGVar5;
  GlobalBailOutRecordDataRow *rowToInsert;
  GlobalBailOutRecordDataRow *rowToUpdate;
  TrackAllocData local_50;
  undefined4 local_28;
  byte local_22;
  byte local_21;
  int INITIAL_TABLE_SIZE;
  bool isInt_local;
  uint32 uStack_1c;
  bool isFloat_local;
  uint32 regSlot_local;
  uint32 bailOutRecordId_local;
  JitArenaAllocator *allocator_local;
  GlobalBailOutRecordDataTable *this_local;
  
  local_22 = isInt;
  local_21 = isFloat;
  INITIAL_TABLE_SIZE = regSlot;
  uStack_1c = bailOutRecordId;
  _regSlot_local = allocator;
  allocator_local = (JitArenaAllocator *)this;
  if (offset == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0xbbf,"(offset != 0)","offset != 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_28 = 0x40;
  if (this->size == 0) {
    if (this->length != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0xbc3,"(length == 0)","length == 0");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_00 = _regSlot_local;
    this->size = 0x40;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,(type_info *)&GlobalBailOutRecordDataRow::typeinfo,0,(ulong)this->size,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
               ,0xbc5);
    this_01 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             this_00,&local_50);
    pGVar5 = Memory::AllocateArray<Memory::JitArenaAllocator,GlobalBailOutRecordDataRow,false>
                       ((Memory *)this_01,(JitArenaAllocator *)Memory::JitArenaAllocator::AllocZero,
                        0,(ulong)this->size);
    this->globalBailOutRecordDataRows = pGVar5;
  }
  if (lastUpdatedRowIndex == (uint *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0xbc8,"(lastUpdatedRowIndex != nullptr)","lastUpdatedRowIndex != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((((*lastUpdatedRowIndex == 0xffffffff) ||
       (pGVar5 = this->globalBailOutRecordDataRows + *lastUpdatedRowIndex, pGVar5->offset != offset)
       ) || (*(uint *)&pGVar5->field_0xc >> 0x1f != (uint)(local_22 & 1))) ||
     (((*(uint *)&pGVar5->field_0xc >> 0x1e & 1) != (uint)(local_21 & 1) ||
      (pGVar5->end + 1 != uStack_1c)))) {
    if (this->length == this->size) {
      this->size = this->length << 1;
      pGVar5 = (GlobalBailOutRecordDataRow *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Realloc
                         ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          _regSlot_local,this->globalBailOutRecordDataRows,(ulong)this->length << 4,
                          (ulong)this->size << 4);
      this->globalBailOutRecordDataRows = pGVar5;
    }
    pGVar5 = this->globalBailOutRecordDataRows + this->length;
    pGVar5->start = uStack_1c;
    pGVar5->end = uStack_1c;
    pGVar5->offset = offset;
    *(uint *)&pGVar5->field_0xc =
         *(uint *)&pGVar5->field_0xc & 0xbfffffff | (uint)(local_21 & 1) << 0x1e;
    *(uint *)&pGVar5->field_0xc =
         *(uint *)&pGVar5->field_0xc & 0x7fffffff | (uint)(local_22 & 1) << 0x1f;
    *(uint *)&pGVar5->field_0xc =
         *(uint *)&pGVar5->field_0xc & 0xc0000000 | INITIAL_TABLE_SIZE & 0x3fffffffU;
    uVar1 = this->length;
    this->length = uVar1 + 1;
    *lastUpdatedRowIndex = uVar1;
  }
  else {
    if ((*(uint *)&pGVar5->field_0xc & 0x3fffffff) != INITIAL_TABLE_SIZE) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0xbd2,"(rowToUpdate->regSlot == regSlot)",
                         "rowToUpdate->regSlot == regSlot");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pGVar5->end = uStack_1c;
  }
  return;
}

Assistant:

void  GlobalBailOutRecordDataTable::AddOrUpdateRow(JitArenaAllocator *allocator, uint32 bailOutRecordId, uint32 regSlot, bool isFloat, bool isInt, int32 offset, uint *lastUpdatedRowIndex)
{
    Assert(offset != 0);
    const int INITIAL_TABLE_SIZE = 64;
    if (size == 0)
    {
        Assert(length == 0);
        size = INITIAL_TABLE_SIZE;
        globalBailOutRecordDataRows = JitAnewArrayZ(allocator, GlobalBailOutRecordDataRow, size);
    }

    Assert(lastUpdatedRowIndex != nullptr);

    if ((*lastUpdatedRowIndex) != -1)
    {
        GlobalBailOutRecordDataRow *rowToUpdate = &globalBailOutRecordDataRows[(*lastUpdatedRowIndex)];
        if(rowToUpdate->offset == offset &&
            rowToUpdate->isInt == (unsigned)isInt &&
            rowToUpdate->isFloat == (unsigned)isFloat &&
            rowToUpdate->end + 1 == bailOutRecordId)
        {
            Assert(rowToUpdate->regSlot == regSlot);
            rowToUpdate->end = bailOutRecordId;
            return;
        }
    }

    if (length == size)
    {
        size = length << 1;
        globalBailOutRecordDataRows = (GlobalBailOutRecordDataRow *)allocator->Realloc(globalBailOutRecordDataRows, length * sizeof(GlobalBailOutRecordDataRow), size * sizeof(GlobalBailOutRecordDataRow));
    }
    GlobalBailOutRecordDataRow *rowToInsert = &globalBailOutRecordDataRows[length];
    rowToInsert->start = bailOutRecordId;
    rowToInsert->end = bailOutRecordId;
    rowToInsert->offset = offset;
    rowToInsert->isFloat = isFloat;
    rowToInsert->isInt = isInt;
    rowToInsert->regSlot = regSlot;
    *lastUpdatedRowIndex = length++;
}